

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockBuilderSetNodeSize(ImGuiID node_id,ImVec2 size)

{
  bool bVar1;
  ImGuiDockNode *pIVar2;
  ImGuiDockNode *node;
  ImGuiContext_conflict *ctx;
  float fStack_10;
  ImGuiID node_id_local;
  ImVec2 size_local;
  
  pIVar2 = DockContextFindNodeByID(GImGui,node_id);
  if (pIVar2 != (ImGuiDockNode *)0x0) {
    fStack_10 = size.x;
    bVar1 = false;
    if (0.0 < fStack_10) {
      node_id_local = (ImGuiID)size.y;
      bVar1 = 0.0 < (float)node_id_local;
    }
    if (!bVar1) {
      __assert_fail("size.x > 0.0f && size.y > 0.0f",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                    ,0x3ca8,"void ImGui::DockBuilderSetNodeSize(ImGuiID, ImVec2)");
    }
    pIVar2->SizeRef = size;
    pIVar2->Size = pIVar2->SizeRef;
    *(ushort *)&pIVar2->field_0xbc = *(ushort *)&pIVar2->field_0xbc & 0xffc7 | 8;
  }
  return;
}

Assistant:

void ImGui::DockBuilderSetNodeSize(ImGuiID node_id, ImVec2 size)
{
    ImGuiContext* ctx = GImGui;
    ImGuiDockNode* node = DockContextFindNodeByID(ctx, node_id);
    if (node == NULL)
        return;
    IM_ASSERT(size.x > 0.0f && size.y > 0.0f);
    node->Size = node->SizeRef = size;
    node->AuthorityForSize = ImGuiDataAuthority_DockNode;
}